

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::Reference> * __thiscall
tinyusdz::MetaVariable::get_value<tinyusdz::Reference>
          (optional<tinyusdz::Reference> *__return_storage_ptr__,MetaVariable *this)

{
  Reference *value;
  
  value = tinyusdz::value::Value::as<tinyusdz::Reference>(&this->_value,false);
  if (value == (Reference *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    memset(&__return_storage_ptr__->contained,0,0x150);
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Reference>::optional<const_tinyusdz::Reference_&,_0>
              (__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }